

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
sjtu::
map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
::erase_fixup(map<long,_sjtu::LRUCache<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>::CacheNode_*,_std::less<long>_>
              *this,Node *x)

{
  color_type cVar1;
  color_type cVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  color_type __tmp;
  
code_r0x00113f7c:
  do {
    while( true ) {
      pNVar4 = x->parent;
      pNVar3 = this->nil;
      if ((pNVar4 == pNVar3) || (x->color != BLACK)) {
        x->color = BLACK;
        return;
      }
      pNVar6 = pNVar4->left;
      if (pNVar6 != x) break;
      pNVar6 = pNVar4->right;
      cVar1 = pNVar6->color;
      if (cVar1 == RED) {
        pNVar5 = pNVar6->left;
        pNVar4 = pNVar6->parent;
        if (pNVar5 != pNVar3) {
          pNVar5->parent = pNVar4;
        }
        pNVar4->right = pNVar5;
        pNVar3 = pNVar4->parent;
        (&pNVar3->left)[pNVar3->left != pNVar4] = pNVar6;
        pNVar6->parent = pNVar3;
        pNVar4->parent = pNVar6;
        pNVar6->left = pNVar4;
        goto LAB_001140fb;
      }
      pNVar5 = pNVar6->left;
      cVar2 = pNVar6->right->color;
      pNVar7 = pNVar6;
      if (pNVar5->color == BLACK) {
        if (cVar2 == BLACK) goto LAB_00114080;
      }
      else if (cVar2 == BLACK) {
        pNVar4 = pNVar5->right;
        pNVar7 = pNVar5->parent;
        if (pNVar4 != pNVar3) {
          pNVar4->parent = pNVar7;
        }
        pNVar7->left = pNVar4;
        pNVar4 = pNVar7->parent;
        (&pNVar4->left)[pNVar4->left != pNVar7] = pNVar5;
        pNVar5->parent = pNVar4;
        pNVar7->parent = pNVar5;
        pNVar5->right = pNVar7;
        pNVar7 = pNVar6->parent;
        pNVar6->color = pNVar7->color;
        pNVar7->color = cVar1;
        pNVar5 = pNVar7->left;
        pNVar3 = this->nil;
      }
      pNVar4 = pNVar7->parent;
      if (pNVar5 != pNVar3) {
        pNVar5->parent = pNVar4;
      }
      pNVar4->right = pNVar5;
      pNVar3 = pNVar4->parent;
      (&pNVar3->left)[pNVar3->left != pNVar4] = pNVar7;
      pNVar7->parent = pNVar3;
      pNVar4->parent = pNVar7;
      pNVar7->left = pNVar4;
      pNVar7->color = pNVar4->color;
      pNVar4->color = cVar1;
      pNVar4 = pNVar7->right;
LAB_001141a0:
      pNVar4->color = BLACK;
      x = this->nil->left;
    }
    cVar1 = pNVar6->color;
    if (cVar1 != RED) {
      pNVar5 = pNVar6;
      if (pNVar6->left->color == BLACK) {
        pNVar5 = pNVar6->right;
        if (pNVar5->color == BLACK) {
LAB_00114080:
          pNVar6->color = RED;
          x = pNVar4;
          goto code_r0x00113f7c;
        }
        pNVar4 = pNVar5->left;
        pNVar7 = pNVar5->parent;
        if (pNVar4 != pNVar3) {
          pNVar4->parent = pNVar7;
        }
        pNVar7->right = pNVar4;
        pNVar4 = pNVar7->parent;
        (&pNVar4->left)[pNVar4->left != pNVar7] = pNVar5;
        pNVar5->parent = pNVar4;
        pNVar7->parent = pNVar5;
        pNVar5->left = pNVar7;
        pNVar5 = pNVar6->parent;
        pNVar6->color = pNVar5->color;
        pNVar5->color = cVar1;
        pNVar3 = this->nil;
      }
      pNVar4 = pNVar5->right;
      pNVar6 = pNVar5->parent;
      if (pNVar4 != pNVar3) {
        pNVar4->parent = pNVar6;
      }
      pNVar6->left = pNVar4;
      pNVar4 = pNVar6->parent;
      (&pNVar4->left)[pNVar4->left != pNVar6] = pNVar5;
      pNVar5->parent = pNVar4;
      pNVar6->parent = pNVar5;
      pNVar5->right = pNVar6;
      pNVar5->color = pNVar6->color;
      pNVar6->color = cVar1;
      pNVar4 = pNVar5->left;
      goto LAB_001141a0;
    }
    pNVar5 = pNVar6->right;
    pNVar4 = pNVar6->parent;
    if (pNVar5 != pNVar3) {
      pNVar5->parent = pNVar4;
    }
    pNVar4->left = pNVar5;
    pNVar3 = pNVar4->parent;
    (&pNVar3->left)[pNVar3->left != pNVar4] = pNVar6;
    pNVar6->parent = pNVar3;
    pNVar4->parent = pNVar6;
    pNVar6->right = pNVar4;
LAB_001140fb:
    pNVar6->color = pNVar4->color;
    pNVar4->color = RED;
  } while( true );
}

Assistant:

void erase_fixup(Node *x)
	{
		for (Node *y;x -> parent != nil && x -> color == BLACK;)
			if (x -> parent -> left == x)
			{
				y = x -> parent -> right;
				if (y -> color == RED) left_rotate(y) , std::swap(y -> color , y -> left -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> right -> color == BLACK)
					{
						right_rotate(y -> left) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					left_rotate(y) , std::swap(y -> color , y -> left -> color) , y -> right -> color = BLACK;
					x = nil -> left;
				}
			}
			else
			{
				y = x -> parent -> left;
				if (y -> color == RED) right_rotate(y) , std::swap(y -> color , y -> right -> color);
				else if (y -> left -> color == BLACK && y -> right -> color == BLACK) y -> color = RED , x = x -> parent;
				else
				{
					if (y -> left -> color == BLACK)
					{
						left_rotate(y -> right) , std::swap(y -> color , y -> parent -> color);
						y = y -> parent;
					}
					right_rotate(y) , std::swap(y -> color , y -> right -> color) , y -> left -> color = BLACK;
					x = nil -> left;
				}
			}
		x -> color = BLACK;
	}